

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Connection_testSpike_Test::TestBody(Connection_testSpike_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  Connection s;
  Neuron n;
  float local_c8 [2];
  Connection local_c0;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [2];
  float local_7c;
  Neuron local_78;
  
  Neuron::Neuron(&local_78,10.0,1.0,50.0);
  local_c0.m_target = (Neuron *)((ulong)local_c0.m_target._4_4_ << 0x20);
  local_a8.data_._0_4_ = Neuron::syn(&local_78);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)local_98,"0","n.syn()",(int *)&local_c0,(float *)&local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_90[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_90[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_c0.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_c0.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_c0.m_target + 8))();
      }
      local_c0.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Connection::Connection((Connection *)local_98,&local_78,10.0,100.0,100.0);
  Connection::spike((Connection *)local_98);
  Connection::Connection(&local_c0,(Neuron *)0x0,10.0,100.0,100.0);
  local_c8[0] = Connection::weight(&local_c0);
  local_7c = Neuron::syn(&local_78);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&local_a8,"Connection(0, 10).weight()","n.syn()",local_c8,&local_7c);
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_c0.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_c0.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_c0.m_target + 8))();
      }
      local_c0.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ::~vector(&local_78.m_watchFor);
  if (local_78.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_incomingSpikes.
                    super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Connection, testSpike)
{
    Neuron n;
    EXPECT_EQ(0, n.syn());
    Connection s(&n, 10);
    s.spike();
    EXPECT_EQ(Connection(0, 10).weight(), n.syn());
}